

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

void __thiscall
bsim::quad_value_bit_vector::quad_value_bit_vector(quad_value_bit_vector *this,int N_,int val)

{
  uchar uVar1;
  undefined8 in_RAX;
  int i;
  ulong uVar2;
  undefined8 uStack_28;
  
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->N = N_;
  uStack_28 = in_RAX;
  std::vector<bsim::quad_value,_std::allocator<bsim::quad_value>_>::resize(&this->bits,(long)N_);
  for (uVar2 = 0; (long)uVar2 < (long)this->N; uVar2 = uVar2 + 1) {
    if (uVar2 < 0x20) {
      quad_value::quad_value
                ((quad_value *)((long)&uStack_28 + 7),((uint)val >> ((uint)uVar2 & 0x1f) & 1) != 0);
      uVar1 = uStack_28._7_1_;
    }
    else {
      uVar1 = '\0';
    }
    (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2].value = uVar1;
  }
  return;
}

Assistant:

quad_value_bit_vector(const int N_, const int val) : N(N_) {
      //bits.resize(NUM_BYTES(N));
      bits.resize(N);

      for (int i = 0; i < N; i++) {
        if (i < ((int) sizeof(int)*8)) {
          set(i, quad_value((val >> i) & 0x01));
        } else {
          set(i, quad_value(0));
        }
      }
    }